

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O1

bool anon_unknown.dwarf_1197c6c::ExpandMacros<cmCMakePresetsGraph::TestPreset>
               (cmCMakePresetsGraph *graph,TestPreset *preset,
               optional<cmCMakePresetsGraph::TestPreset> *out)

{
  _Base_ptr p_Var1;
  element_type *peVar2;
  pointer pbVar3;
  bool bVar4;
  int iVar5;
  ExpandMacroResult EVar6;
  mapped_type *pmVar7;
  _Base_ptr p_Var8;
  optional<cmCMakePresetsGraph::TestPreset> *poVar9;
  byte bVar10;
  _Link_type __x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *overwrite;
  pointer out_00;
  bool bVar11;
  optional<bool> result;
  vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
  macroExpanders;
  MacroExpander environmentMacroExpander;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
  envCycles;
  undefined1 local_c8 [32];
  undefined1 local_a8 [32];
  undefined1 local_88 [48];
  _Rb_tree_node_base local_58;
  undefined8 local_38;
  
  std::optional<cmCMakePresetsGraph::TestPreset>::emplace<cmCMakePresetsGraph::TestPreset_const&>
            (out,preset);
  local_58._M_left = &local_58;
  local_58._M_color = _S_red;
  local_58._M_parent = (_Base_ptr)0x0;
  local_38 = 0;
  p_Var8 = (out->super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>)._M_payload.
           super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>.
           super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._M_payload._M_value.
           super_Preset.Environment._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = (_Base_ptr)
           ((long)&(out->super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>).
                   _M_payload.
                   super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>.
                   super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._M_payload + 0xb0);
  local_58._M_right = local_58._M_left;
  if (p_Var8 != p_Var1) {
    do {
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                             *)(local_88 + 0x28),(key_type *)(p_Var8 + 1));
      *pmVar7 = Unvisited;
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while (p_Var8 != p_Var1);
  }
  local_c8._0_8_ = (pointer)0x0;
  local_c8._8_8_ = (_Base_ptr)0x0;
  local_c8._16_8_ = (_Base_ptr)0x0;
  local_a8._24_8_ =
       std::
       _Function_handler<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCMakePresetsGraph.cxx:354:5)>
       ::_M_invoke;
  local_a8._16_8_ =
       std::
       _Function_handler<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCMakePresetsGraph.cxx:354:5)>
       ::_M_manager;
  local_88._16_8_ = (_Base_ptr)0x0;
  local_88._24_8_ = (_Base_ptr)0x0;
  local_88._0_8_ = 0;
  local_88._8_8_ = (_Base_ptr)0x0;
  local_a8._0_8_ = graph;
  local_a8._8_8_ = preset;
  local_88._0_8_ = operator_new(0x18);
  *(vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
    **)local_88._0_8_ =
       (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
        *)local_c8;
  *(optional<cmCMakePresetsGraph::TestPreset> **)(local_88._0_8_ + 8) = out;
  *(undefined1 **)(local_88._0_8_ + 0x10) = local_88 + 0x28;
  local_88._24_8_ =
       std::
       _Function_handler<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCMakePresetsGraph.cxx:413:5)>
       ::_M_invoke;
  local_88._16_8_ =
       std::
       _Function_handler<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCMakePresetsGraph.cxx:413:5)>
       ::_M_manager;
  std::
  vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
  ::push_back((vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
               *)local_c8,(value_type *)local_a8);
  __x = (_Link_type)local_88;
  std::
  vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
  ::push_back((vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
               *)local_c8,(value_type *)__x);
  p_Var8 = (out->super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>)._M_payload.
           super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>.
           super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._M_payload._M_value.
           super_Preset.Environment._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar11 = p_Var8 == p_Var1;
  poVar9 = out;
  if (!bVar11) {
    do {
      if ((char)p_Var8[3]._M_color == _S_black) {
        __x = (_Link_type)(p_Var8 + 1);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                               *)(local_88 + 0x28),(key_type *)__x);
        EVar6 = Ok;
        if (*pmVar7 != Verified) {
          if (*pmVar7 == InProgress) {
            EVar6 = Error;
          }
          else {
            iVar5 = ((preset->super_Preset).OriginFile)->Version;
            *pmVar7 = InProgress;
            __x = (_Link_type)local_c8;
            EVar6 = ExpandMacros((string *)(p_Var8 + 2),
                                 (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                                  *)__x,iVar5);
            if (EVar6 == Ok) {
              *pmVar7 = Verified;
              EVar6 = Ok;
            }
          }
        }
        if (EVar6 == Ignore) {
          poVar9 = (optional<cmCMakePresetsGraph::TestPreset> *)&DAT_00000001;
          if ((out->super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>)._M_payload.
              super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>.
              super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._M_engaged == true) {
            (out->super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>)._M_payload.
            super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>.
            super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._M_engaged = false;
            cmCMakePresetsGraph::TestPreset::~TestPreset((TestPreset *)out);
          }
          bVar4 = false;
        }
        else {
          if (EVar6 != Error) goto LAB_003495b9;
          bVar4 = false;
          poVar9 = (optional<cmCMakePresetsGraph::TestPreset> *)0x0;
        }
      }
      else {
LAB_003495b9:
        bVar4 = true;
      }
      if (!bVar4) break;
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
      bVar11 = p_Var8 == p_Var1;
    } while (!bVar11);
  }
  bVar10 = (byte)poVar9;
  if (!bVar11) goto LAB_003499ae;
  peVar2 = (preset->super_Preset).ConditionEvaluator.
           super___shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2 != (element_type *)0x0) {
    __x = (_Link_type)local_c8;
    iVar5 = (*peVar2->_vptr_Condition[2])
                      (peVar2,__x,(ulong)(uint)((preset->super_Preset).OriginFile)->Version);
    if ((char)iVar5 == '\0') {
      bVar10 = 0;
    }
    else {
      bVar10 = 1;
      if ((out->super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>)._M_payload.
          super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>.
          super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._M_engaged == true) {
        (out->super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>)._M_payload.
        super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>.
        super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._M_engaged = false;
        cmCMakePresetsGraph::TestPreset::~TestPreset((TestPreset *)out);
      }
    }
    goto LAB_003499ae;
  }
  out_00 = (out->super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>)._M_payload.
           super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>.
           super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._M_payload._M_value.
           OverwriteConfigurationFile.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (out->super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>)._M_payload.
           super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>.
           super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._M_payload._M_value.
           OverwriteConfigurationFile.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar11 = out_00 == pbVar3;
  poVar9 = out;
  if (!bVar11) {
    bVar11 = false;
    do {
      __x = (_Link_type)local_c8;
      EVar6 = ExpandMacros(out_00,(vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                                   *)local_c8,((preset->super_Preset).OriginFile)->Version);
      if (EVar6 == Error) {
        bVar4 = false;
        poVar9 = (optional<cmCMakePresetsGraph::TestPreset> *)0x0;
      }
      else if (EVar6 == Ignore) {
        poVar9 = (optional<cmCMakePresetsGraph::TestPreset> *)&DAT_00000001;
        if ((out->super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>)._M_payload.
            super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>.
            super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._M_engaged == true) {
          (out->super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>)._M_payload.
          super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>.
          super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._M_engaged = false;
          cmCMakePresetsGraph::TestPreset::~TestPreset((TestPreset *)out);
        }
        bVar4 = false;
      }
      else {
        bVar4 = true;
      }
      if (!bVar4) break;
      out_00 = out_00 + 1;
      bVar11 = out_00 == pbVar3;
    } while (!bVar11);
  }
  bVar10 = (byte)poVar9;
  if (!bVar11) goto LAB_003499ae;
  if ((out->super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>)._M_payload.
      super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>.
      super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._M_payload.field2[0x1b8] ==
      '\x01') {
    __x = (_Link_type)local_c8;
    EVar6 = ExpandMacros(&(out->super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>)
                          ._M_payload.
                          super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>
                          .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._M_payload.
                          _M_value.Output.
                          super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>
                          ._M_payload.
                          super__Optional_payload<cmCMakePresetsGraph::TestPreset::OutputOptions,_true,_false,_false>
                          .
                          super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>
                          ._M_payload._M_value.OutputLogFile,
                         (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                          *)__x,((preset->super_Preset).OriginFile)->Version);
    if (EVar6 != Error) {
      if (EVar6 != Ignore) {
        __x = (_Link_type)local_c8;
        EVar6 = ExpandMacros(&(out->
                              super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>).
                              _M_payload.
                              super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>
                              .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>.
                              _M_payload._M_value.Output.
                              super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>
                              ._M_payload.
                              super__Optional_payload<cmCMakePresetsGraph::TestPreset::OutputOptions,_true,_false,_false>
                              .
                              super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>
                              ._M_payload._M_value.OutputJUnitFile,
                             (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                              *)__x,((preset->super_Preset).OriginFile)->Version);
        if (EVar6 == Error) goto LAB_003499a7;
        if (EVar6 != Ignore) goto LAB_00349774;
      }
LAB_0034998a:
      bVar10 = 1;
      if ((out->super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>)._M_payload.
          super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>.
          super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._M_engaged != true)
      goto LAB_003499ae;
      (out->super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>)._M_payload.
      super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>.
      super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._M_engaged = false;
LAB_003499a0:
      bVar10 = 1;
      cmCMakePresetsGraph::TestPreset::~TestPreset((TestPreset *)out);
      goto LAB_003499ae;
    }
  }
  else {
LAB_00349774:
    if ((out->super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>)._M_payload.
        super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>.
        super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._M_payload.field2[0x318] !=
        '\x01') goto LAB_0034995a;
    if ((out->super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>)._M_payload.
        super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>.
        super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._M_payload.field2[0x260] !=
        '\x01') goto LAB_00349824;
    __x = (_Link_type)local_c8;
    EVar6 = ExpandMacros((string *)
                         &(out->super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>)
                          ._M_payload.
                          super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>
                          .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._M_payload.
                          _M_value.Filter,
                         (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                          *)__x,((preset->super_Preset).OriginFile)->Version);
    if (EVar6 == Error) goto LAB_003499a7;
    if (EVar6 == Ignore) goto LAB_0034998a;
    __x = (_Link_type)local_c8;
    EVar6 = ExpandMacros(&(out->super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>)
                          ._M_payload.
                          super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>
                          .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._M_payload.
                          _M_value.Filter.
                          super__Optional_base<cmCMakePresetsGraph::TestPreset::FilterOptions,_false,_false>
                          ._M_payload.
                          super__Optional_payload<cmCMakePresetsGraph::TestPreset::FilterOptions,_true,_false,_false>
                          .
                          super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::FilterOptions>
                          ._M_payload._M_value.Include.
                          super__Optional_base<cmCMakePresetsGraph::TestPreset::IncludeOptions,_false,_false>
                          ._M_payload.
                          super__Optional_payload<cmCMakePresetsGraph::TestPreset::IncludeOptions,_true,_false,_false>
                          .
                          super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::IncludeOptions>
                          ._M_payload._M_value.Label,
                         (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                          *)__x,((preset->super_Preset).OriginFile)->Version);
    if (EVar6 == Error) goto LAB_003499a7;
    if (EVar6 == Ignore) goto LAB_0034998a;
    if ((out->super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>)._M_payload.
        super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>.
        super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._M_payload.field2[0x250] ==
        '\x01') {
      __x = (_Link_type)local_c8;
      EVar6 = ExpandMacros(&(out->
                            super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>).
                            _M_payload.
                            super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>
                            .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>.
                            _M_payload._M_value.Filter.
                            super__Optional_base<cmCMakePresetsGraph::TestPreset::FilterOptions,_false,_false>
                            ._M_payload.
                            super__Optional_payload<cmCMakePresetsGraph::TestPreset::FilterOptions,_true,_false,_false>
                            .
                            super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::FilterOptions>
                            ._M_payload._M_value.Include.
                            super__Optional_base<cmCMakePresetsGraph::TestPreset::IncludeOptions,_false,_false>
                            ._M_payload.
                            super__Optional_payload<cmCMakePresetsGraph::TestPreset::IncludeOptions,_true,_false,_false>
                            .
                            super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::IncludeOptions>
                            ._M_payload._M_value.Index.
                            super__Optional_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions,_false,_false>
                            ._M_payload.
                            super__Optional_payload<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions,_true,_false,_false>
                            .
                            super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>
                            ._M_payload._M_value.IndexFile,
                           (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                            *)__x,((preset->super_Preset).OriginFile)->Version);
      if (EVar6 == Error) goto LAB_003499a7;
      if (EVar6 == Ignore) goto LAB_0034998a;
    }
LAB_00349824:
    if ((out->super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>)._M_payload.
        super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>.
        super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._M_payload.field2[0x310] !=
        '\x01') {
LAB_0034995a:
      if ((out->super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>)._M_payload.
          super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>.
          super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._M_payload.field2[0x380] ==
          '\x01') {
        __x = (_Link_type)local_c8;
        EVar6 = ExpandMacros(&(out->
                              super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>).
                              _M_payload.
                              super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>
                              .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>.
                              _M_payload._M_value.Execution.
                              super__Optional_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_false,_false>
                              ._M_payload.
                              super__Optional_payload<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_true,_false,_false>
                              .
                              super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions>
                              ._M_payload._M_value.ResourceSpecFile,
                             (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                              *)__x,((preset->super_Preset).OriginFile)->Version);
        if (EVar6 == Error) goto LAB_003499a7;
        if (EVar6 == Ignore) goto LAB_0034998a;
      }
LAB_003499ab:
      bVar10 = 1;
      goto LAB_003499ae;
    }
    __x = (_Link_type)local_c8;
    EVar6 = ExpandMacros((string *)
                         &(out->super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>)
                          ._M_payload.
                          super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>
                          .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._M_payload.
                          _M_value.Filter.
                          super__Optional_base<cmCMakePresetsGraph::TestPreset::FilterOptions,_false,_false>
                          ._M_payload.
                          super__Optional_payload<cmCMakePresetsGraph::TestPreset::FilterOptions,_true,_false,_false>
                          .
                          super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::FilterOptions>
                          ._M_payload._M_value.Exclude,
                         (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                          *)__x,((preset->super_Preset).OriginFile)->Version);
    if (EVar6 == Error) goto LAB_003499a7;
    if (EVar6 == Ignore) goto LAB_0034998a;
    __x = (_Link_type)local_c8;
    EVar6 = ExpandMacros(&(out->super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>)
                          ._M_payload.
                          super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>
                          .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._M_payload.
                          _M_value.Filter.
                          super__Optional_base<cmCMakePresetsGraph::TestPreset::FilterOptions,_false,_false>
                          ._M_payload.
                          super__Optional_payload<cmCMakePresetsGraph::TestPreset::FilterOptions,_true,_false,_false>
                          .
                          super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::FilterOptions>
                          ._M_payload._M_value.Exclude.
                          super__Optional_base<cmCMakePresetsGraph::TestPreset::ExcludeOptions,_false,_false>
                          ._M_payload.
                          super__Optional_payload<cmCMakePresetsGraph::TestPreset::ExcludeOptions,_true,_false,_false>
                          .
                          super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExcludeOptions>
                          ._M_payload._M_value.Label,
                         (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                          *)__x,((preset->super_Preset).OriginFile)->Version);
    if (EVar6 == Error) goto LAB_003499a7;
    if (EVar6 == Ignore) goto LAB_0034998a;
    if ((out->super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>)._M_payload.
        super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>.
        super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._M_payload.field2[0x308] !=
        '\x01') goto LAB_0034995a;
    __x = (_Link_type)local_c8;
    EVar6 = ExpandMacros((string *)
                         &(out->super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>)
                          ._M_payload.
                          super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>
                          .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._M_payload.
                          _M_value.Filter.
                          super__Optional_base<cmCMakePresetsGraph::TestPreset::FilterOptions,_false,_false>
                          ._M_payload.
                          super__Optional_payload<cmCMakePresetsGraph::TestPreset::FilterOptions,_true,_false,_false>
                          .
                          super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::FilterOptions>
                          ._M_payload._M_value.Exclude.
                          super__Optional_base<cmCMakePresetsGraph::TestPreset::ExcludeOptions,_false,_false>
                          ._M_payload.
                          super__Optional_payload<cmCMakePresetsGraph::TestPreset::ExcludeOptions,_true,_false,_false>
                          .
                          super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExcludeOptions>
                          ._M_payload._M_value.Fixtures,
                         (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                          *)__x,((preset->super_Preset).OriginFile)->Version);
    if (EVar6 == Error) goto LAB_003499a7;
    if (EVar6 == Ignore) goto LAB_0034998a;
    __x = (_Link_type)local_c8;
    EVar6 = ExpandMacros(&(out->super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>)
                          ._M_payload.
                          super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>
                          .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._M_payload.
                          _M_value.Filter.
                          super__Optional_base<cmCMakePresetsGraph::TestPreset::FilterOptions,_false,_false>
                          ._M_payload.
                          super__Optional_payload<cmCMakePresetsGraph::TestPreset::FilterOptions,_true,_false,_false>
                          .
                          super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::FilterOptions>
                          ._M_payload._M_value.Exclude.
                          super__Optional_base<cmCMakePresetsGraph::TestPreset::ExcludeOptions,_false,_false>
                          ._M_payload.
                          super__Optional_payload<cmCMakePresetsGraph::TestPreset::ExcludeOptions,_true,_false,_false>
                          .
                          super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExcludeOptions>
                          ._M_payload._M_value.Fixtures.
                          super__Optional_base<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions,_false,_false>
                          ._M_payload.
                          super__Optional_payload<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions,_true,_false,_false>
                          .
                          super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions>
                          ._M_payload._M_value.Setup,
                         (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                          *)__x,((preset->super_Preset).OriginFile)->Version);
    if (EVar6 != Error) {
      if (EVar6 == Ignore) {
        bVar10 = 1;
        if ((out->super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>)._M_payload.
            super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>.
            super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._M_engaged != true)
        goto LAB_003499ae;
        (out->super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>)._M_payload.
        super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>.
        super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._M_engaged = false;
        goto LAB_003499a0;
      }
      __x = (_Link_type)local_c8;
      EVar6 = ExpandMacros(&(out->
                            super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>).
                            _M_payload.
                            super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>
                            .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>.
                            _M_payload._M_value.Filter.
                            super__Optional_base<cmCMakePresetsGraph::TestPreset::FilterOptions,_false,_false>
                            ._M_payload.
                            super__Optional_payload<cmCMakePresetsGraph::TestPreset::FilterOptions,_true,_false,_false>
                            .
                            super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::FilterOptions>
                            ._M_payload._M_value.Exclude.
                            super__Optional_base<cmCMakePresetsGraph::TestPreset::ExcludeOptions,_false,_false>
                            ._M_payload.
                            super__Optional_payload<cmCMakePresetsGraph::TestPreset::ExcludeOptions,_true,_false,_false>
                            .
                            super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExcludeOptions>
                            ._M_payload._M_value.Fixtures.
                            super__Optional_base<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions,_false,_false>
                            ._M_payload.
                            super__Optional_payload<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions,_true,_false,_false>
                            .
                            super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions>
                            ._M_payload._M_value.Cleanup,
                           (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                            *)__x,((preset->super_Preset).OriginFile)->Version);
      if (EVar6 != Error) {
        if (EVar6 != Ignore) goto LAB_0034995a;
        if ((out->super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>)._M_payload.
            super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>.
            super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._M_engaged == true) {
          (out->super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>)._M_payload.
          super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>.
          super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._M_engaged = false;
          cmCMakePresetsGraph::TestPreset::~TestPreset((TestPreset *)out);
        }
        goto LAB_003499ab;
      }
    }
  }
LAB_003499a7:
  bVar10 = 0;
LAB_003499ae:
  if ((_Base_ptr)local_88._16_8_ != (_Base_ptr)0x0) {
    __x = (_Link_type)local_88;
    (*(code *)local_88._16_8_)(__x,__x,3);
  }
  if ((_Base_ptr)local_a8._16_8_ != (_Base_ptr)0x0) {
    __x = (_Link_type)local_a8;
    (*(code *)local_a8._16_8_)(__x,__x,3);
  }
  std::
  vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
  ::~vector((vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
             *)local_c8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
              *)local_58._M_parent,__x);
  return (bool)(bVar10 & 1);
}

Assistant:

bool ExpandMacros(const cmCMakePresetsGraph& graph, const T& preset,
                  cm::optional<T>& out)
{
  out.emplace(preset);

  std::map<std::string, CycleStatus> envCycles;
  for (auto const& v : out->Environment) {
    envCycles[v.first] = CycleStatus::Unvisited;
  }

  std::vector<MacroExpander> macroExpanders;

  MacroExpander defaultMacroExpander =
    [&graph, &preset](const std::string& macroNamespace,
                      const std::string& macroName, std::string& macroOut,
                      int version) -> ExpandMacroResult {
    if (macroNamespace.empty()) {
      if (macroName == "sourceDir") {
        macroOut += graph.SourceDir;
        return ExpandMacroResult::Ok;
      }
      if (macroName == "sourceParentDir") {
        macroOut += cmSystemTools::GetParentDirectory(graph.SourceDir);
        return ExpandMacroResult::Ok;
      }
      if (macroName == "sourceDirName") {
        macroOut += cmSystemTools::GetFilenameName(graph.SourceDir);
        return ExpandMacroResult::Ok;
      }
      if (macroName == "presetName") {
        macroOut += preset.Name;
        return ExpandMacroResult::Ok;
      }
      if (macroName == "generator") {
        // Generator only makes sense if preset is not hidden.
        if (!preset.Hidden) {
          macroOut += graph.GetGeneratorForPreset(preset.Name);
        }
        return ExpandMacroResult::Ok;
      }
      if (macroName == "dollar") {
        macroOut += '$';
        return ExpandMacroResult::Ok;
      }
      if (macroName == "hostSystemName") {
        if (version < 3) {
          return ExpandMacroResult::Error;
        }
        macroOut += cmSystemTools::GetSystemName();
        return ExpandMacroResult::Ok;
      }
      if (macroName == "fileDir") {
        if (version < 4) {
          return ExpandMacroResult::Error;
        }
        macroOut +=
          cmSystemTools::GetParentDirectory(preset.OriginFile->Filename);
        return ExpandMacroResult::Ok;
      }
      if (macroName == "pathListSep") {
        if (version < 5) {
          return ExpandMacroResult::Error;
        }
        macroOut += cmSystemTools::GetSystemPathlistSeparator();
        return ExpandMacroResult::Ok;
      }
    }

    return ExpandMacroResult::Ignore;
  };

  MacroExpander environmentMacroExpander =
    [&macroExpanders, &out, &envCycles](
      const std::string& macroNamespace, const std::string& macroName,
      std::string& result, int version) -> ExpandMacroResult {
    if (macroNamespace == "env" && !macroName.empty() && out) {
      auto v = out->Environment.find(macroName);
      if (v != out->Environment.end() && v->second) {
        auto e =
          VisitEnv(*v->second, envCycles[macroName], macroExpanders, version);
        if (e != ExpandMacroResult::Ok) {
          return e;
        }
        result += *v->second;
        return ExpandMacroResult::Ok;
      }
    }

    if (macroNamespace == "env" || macroNamespace == "penv") {
      if (macroName.empty()) {
        return ExpandMacroResult::Error;
      }
      const char* value = std::getenv(macroName.c_str());
      if (value) {
        result += value;
      }
      return ExpandMacroResult::Ok;
    }

    return ExpandMacroResult::Ignore;
  };

  macroExpanders.push_back(defaultMacroExpander);
  macroExpanders.push_back(environmentMacroExpander);

  for (auto& v : out->Environment) {
    if (v.second) {
      switch (VisitEnv(*v.second, envCycles[v.first], macroExpanders,
                       graph.GetVersion(preset))) {
        case ExpandMacroResult::Error:
          return false;
        case ExpandMacroResult::Ignore:
          out.reset();
          return true;
        case ExpandMacroResult::Ok:
          break;
      }
    }
  }

  if (preset.ConditionEvaluator) {
    cm::optional<bool> result;
    if (!preset.ConditionEvaluator->Evaluate(
          macroExpanders, graph.GetVersion(preset), result)) {
      return false;
    }
    if (!result) {
      out.reset();
      return true;
    }
    out->ConditionResult = *result;
  }

  return ExpandMacros(graph, preset, out, macroExpanders);
}